

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::DirectoryTreeSignatureTask::start
          (DirectoryTreeSignatureTask *this,TaskInterface ti)

{
  size_t in_RCX;
  StringList *in_R8;
  StringRef path;
  StringRef path_00;
  TaskInterface local_60;
  BuildKey local_50;
  string local_30 [32];
  
  local_60.ctx = ti.ctx;
  local_60.impl = ti.impl;
  if ((this->filters).size == 0) {
    path_00.Length = in_RCX;
    path_00.Data = (char *)(this->path)._M_string_length;
    llbuild::buildsystem::BuildKey::makeDirectoryContents
              (&local_50,(BuildKey *)(this->path)._M_dataplus._M_p,path_00);
  }
  else {
    path.Length = (size_t)&this->filters;
    path.Data = (char *)(this->path)._M_string_length;
    llbuild::buildsystem::BuildKey::makeFilteredDirectoryContents
              (&local_50,(BuildKey *)(this->path)._M_dataplus._M_p,path,in_R8);
  }
  std::__cxx11::string::string(local_30,(string *)&local_50);
  llbuild::core::TaskInterface::request(&local_60,(KeyType *)local_30,0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Ask for the base directory directory contents.
    if (filters.isEmpty()) {
      ti.request(BuildKey::makeDirectoryContents(path).toData(), /*inputID=*/0);
    } else {
      ti.request(BuildKey::makeFilteredDirectoryContents(path, filters).toData(),
                 /*inputID=*/0);
    }
  }